

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.h
# Opt level: O2

GdlRule * __thiscall GdlPass::NewRule(GdlPass *this,GrpLineAndFile *lnf)

{
  GdlRule *this_00;
  GdlRule *pruleNew;
  GdlRule *local_28;
  
  this_00 = (GdlRule *)operator_new(0x128);
  GdlRule::GdlRule(this_00);
  local_28 = this_00;
  GrpLineAndFile::operator=((GrpLineAndFile *)this_00,lnf);
  std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::push_back(&this->m_vprule,&local_28);
  return local_28;
}

Assistant:

GdlRule * NewRule(GrpLineAndFile & lnf)
	{
		GdlRule * pruleNew = new GdlRule();
		pruleNew->SetLineAndFile(lnf);
		m_vprule.push_back(pruleNew);
		return pruleNew;
	}